

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile_caf.c
# Opt level: O0

off_t caf_nextchunk(t_soundfile *sf,off_t offset,t_chunk_conflict *chunk)

{
  int iVar1;
  int64_t iVar2;
  ssize_t sVar3;
  t_soundfile *local_38;
  off_t seekto;
  int64_t chunksize;
  t_chunk_conflict *chunk_local;
  off_t offset_local;
  t_soundfile *sf_local;
  
  iVar1 = sys_isbigendian();
  iVar2 = caf_getchunksize(chunk,(uint)((iVar1 != 0 ^ 0xffU) & 1));
  local_38 = (t_soundfile *)(offset + 0xc + iVar2);
  if (((ulong)local_38 & 1) != 0) {
    local_38 = (t_soundfile *)((long)&local_38->sf_fd + 1);
  }
  sVar3 = fd_read(sf->sf_fd,(off_t)local_38,chunk,0xc);
  if (sVar3 < 0xc) {
    sf_local = (t_soundfile *)0xffffffffffffffff;
  }
  else {
    sf_local = local_38;
  }
  return (off_t)sf_local;
}

Assistant:

static off_t caf_nextchunk(const t_soundfile *sf, off_t offset, t_chunk *chunk)
{
    int64_t chunksize = caf_getchunksize(chunk, !sys_isbigendian());
    off_t seekto = offset + CAFCHUNKSIZE + chunksize;
    if (seekto & 1) /* pad up to even number of bytes */
        seekto++;
    if (fd_read(sf->sf_fd, seekto, (char *)chunk,
        CAFCHUNKSIZE) < CAFCHUNKSIZE)
        return -1;
    return seekto;
}